

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

void __thiscall ExecutorRegVm::InitExecution(ExecutorRegVm *this)

{
  FastVector<char,_true,_true> *this_00;
  uint *__s;
  RegVmRegister *pRVar1;
  uint local_24;
  RegVmCmd local_20;
  
  (this->callStack).count = 0;
  this->lastFinalReturn = 0;
  CommonSetLinker(this->exLinker);
  this_00 = &this->dataStack;
  FastVector<char,_true,_true>::reserve(this_00,this->minStackSize);
  (this->dataStack).count = 0;
  FastVector<char,_true,_true>::resize(this_00,this->exLinker->globalVarSize + 0xf & 0xfffffff0);
  GC::SetUnmanagableRange((this->dataStack).data,(this->dataStack).max);
  *(undefined8 *)((long)&(this->execErrorObject).ptr + 4) = 0;
  this->execErrorMessage = (char *)0x0;
  *(undefined8 *)&this->execErrorObject = 0;
  this->callContinue = true;
  local_20.code = '\"';
  local_20.rA = '\0';
  local_20.rB = '\x05';
  local_20.rC = '\0';
  local_20.argument = 0;
  FastVector<RegVmCmd,_false,_false>::push_back(&this->exLinker->exRegVmCode,&local_20);
  local_24 = 0;
  FastVector<unsigned_int,_false,_false>::push_back(&this->exLinker->exRegVmExecCount,&local_24);
  if (this->tempStackArrayBase == (uint *)0x0) {
    __s = (uint *)(*(code *)NULLC::alloc)(0x10000);
    this->tempStackArrayBase = __s;
    memset(__s,0,0x10000);
    this->tempStackArrayEnd = this->tempStackArrayBase + 0x4000;
  }
  pRVar1 = this->regFileArrayBase;
  if (pRVar1 == (RegVmRegister *)0x0) {
    pRVar1 = (RegVmRegister *)(*(code *)NULLC::alloc)(0x40000);
    this->regFileArrayBase = pRVar1;
    memset(pRVar1,0,0x40000);
    pRVar1 = this->regFileArrayBase;
    this->regFileArrayEnd = pRVar1 + 0x8000;
  }
  this->regFileLastTop = pRVar1;
  if ((this->exLinker->fullLinkerData).count != 0) {
    nullcVmContextMainDataAddress = (uintptr_t)this_00;
  }
  return;
}

Assistant:

void ExecutorRegVm::InitExecution()
{
	callStack.clear();

	lastFinalReturn = 0;

	CommonSetLinker(exLinker);

	dataStack.reserve(minStackSize);
	dataStack.clear();
	dataStack.resize((exLinker->globalVarSize + 0xf) & ~0xf);

	GC::SetUnmanagableRange(dataStack.data, dataStack.max);

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;

	execErrorFinalReturnDepth = 0;

	callContinue = true;

	// Add return after the last instruction to end execution of code with no return at the end
	exLinker->exRegVmCode.push_back(RegVmCmd(rviReturn, 0, rvrError, 0, 0));
	exLinker->exRegVmExecCount.push_back(0);

	if(!tempStackArrayBase)
	{
		tempStackArrayBase = (unsigned*)NULLC::alloc(sizeof(unsigned) * 1024 * 16);
		memset(tempStackArrayBase, 0, sizeof(unsigned) * 1024 * 16);
		tempStackArrayEnd = tempStackArrayBase + 1024 * 16;
	}

	if(!regFileArrayBase)
	{
		regFileArrayBase = (RegVmRegister*)NULLC::alloc(sizeof(RegVmRegister) * 1024 * 32);
		memset(regFileArrayBase, 0, sizeof(RegVmRegister) * 1024 * 32);
		regFileArrayEnd = regFileArrayBase + 1024 * 32;
	}

	regFileLastTop = regFileArrayBase;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(!dcCallVM)
	{
		dcCallVM = dcNewCallVM(4096);
		dcMode(dcCallVM, DC_CALL_C_DEFAULT);
	}
#endif

	if(!exLinker->fullLinkerData.empty())
	{
		nullcVmContextMainDataAddress = uintptr_t(&dataStack);
	}
}